

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O3

DatatypeValidator * xercesc_4_0::DatatypeValidator::loadDV(XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  ulong uVar2;
  DatatypeValidator *pDVar3;
  void *__buf;
  StringHasher *this;
  char16_t *pcVar4;
  char16_t cVar5;
  undefined8 *puVar6;
  int type;
  int flag;
  XMLCh *dvName;
  XMLSize_t dummyDataLen;
  ArrayJanitor<char16_t> local_48;
  int local_34;
  char16_t *local_30;
  XMLSize_t local_28;
  
  XSerializeEngine::operator>>(serEng,&local_34);
  if (local_34 != -3) {
    if (local_34 == -1) {
      uVar2 = 0;
      XSerializeEngine::readString(serEng,&local_30,(XMLSize_t *)&local_48,&local_28,false);
      pcVar4 = local_30;
      manager = XSerializeEngine::getMemoryManager(serEng);
      ArrayJanitor<char16_t>::ArrayJanitor(&local_48,pcVar4,manager);
      if (local_30 != (char16_t *)0x0) {
        uVar2 = (ulong)(ushort)*local_30;
        if (uVar2 == 0) {
          uVar2 = 0;
        }
        else {
          cVar5 = local_30[1];
          if (cVar5 != L'\0') {
            pcVar4 = local_30 + 2;
            do {
              uVar2 = (ulong)(ushort)cVar5 + (uVar2 >> 0x18) + uVar2 * 0x26;
              cVar5 = *pcVar4;
              pcVar4 = pcVar4 + 1;
            } while (cVar5 != L'\0');
          }
          uVar2 = uVar2 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18);
        }
      }
      puVar6 = *(undefined8 **)
                (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) + uVar2 * 8);
      if (puVar6 == (undefined8 *)0x0) {
        pDVar3 = (DatatypeValidator *)0x0;
      }
      else {
        this = (StringHasher *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x30);
        pDVar3 = (DatatypeValidator *)0x0;
        do {
          bVar1 = StringHasher::equals(this,local_30,(void *)puVar6[2]);
          if (bVar1) {
            pDVar3 = (DatatypeValidator *)*puVar6;
            break;
          }
          puVar6 = (undefined8 *)puVar6[1];
        } while (puVar6 != (undefined8 *)0x0);
      }
      ArrayJanitor<char16_t>::~ArrayJanitor(&local_48);
      return pDVar3;
    }
    XSerializeEngine::operator>>(serEng,(int *)&local_48);
    if ((ulong)(uint)local_48.fData < 0x1b) {
      pDVar3 = (DatatypeValidator *)
               XSerializeEngine::read
                         (serEng,(int)(&PTR_classStringDatatypeValidator_0040c7f0)
                                      [(uint)local_48.fData],__buf,0x40c7f0);
      return pDVar3;
    }
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator* DatatypeValidator::loadDV(XSerializeEngine& serEng)
{

    int flag;
    serEng>>flag;

    if (DV_BUILTIN == flag)
    {
        XMLCh* dvName;
        serEng.readString(dvName);
        ArrayJanitor<XMLCh> janName(dvName, serEng.getMemoryManager());

        return DatatypeValidatorFactory::getBuiltInRegistry()->get(dvName);
    }
    else if (DV_ZERO == flag)
    {
        return 0;
    }

    int type;
    serEng>>type;

    switch((ValidatorType)type)
    {
    case String: 
        StringDatatypeValidator* stringdv;
        serEng>>stringdv;
        return stringdv;        
    case AnyURI:
        AnyURIDatatypeValidator* anyuridv;
        serEng>>anyuridv;
        return anyuridv;        
    case QName: 
        QNameDatatypeValidator* qnamedv;
        serEng>>qnamedv;
        return qnamedv;        
    case Name: 
        NameDatatypeValidator* namedv;
        serEng>>namedv;
        return namedv;        
    case NCName:  
        NCNameDatatypeValidator* ncnamedv;
        serEng>>ncnamedv;
        return ncnamedv;        
    case Boolean: 
        BooleanDatatypeValidator* booleandv;
        serEng>>booleandv;
        return booleandv;        
    case Float: 
        FloatDatatypeValidator* floatdv;
        serEng>>floatdv;
        return floatdv;        
    case Double: 
        DoubleDatatypeValidator* doubledv;
        serEng>>doubledv;
        return doubledv;        
    case Decimal: 
        DecimalDatatypeValidator* decimaldv;
        serEng>>decimaldv;
        return decimaldv;        
    case HexBinary:  
        HexBinaryDatatypeValidator* hexbinarydv;
        serEng>>hexbinarydv;
        return hexbinarydv;       
    case Base64Binary: 
        Base64BinaryDatatypeValidator* base64binarydv;
        serEng>>base64binarydv;
        return base64binarydv;      
    case Duration:     
        DurationDatatypeValidator* durationdv;
        serEng>>durationdv;
        return durationdv;
    case DateTime:       
        DateTimeDatatypeValidator* datetimedv;
        serEng>>datetimedv;
        return datetimedv; 
    case Date:          
        DateDatatypeValidator* datedv;
        serEng>>datedv;
        return datedv;
    case Time:         
        TimeDatatypeValidator* timedv;
        serEng>>timedv;
        return timedv;
    case MonthDay:      
        MonthDayDatatypeValidator* monthdaydv;
        serEng>>monthdaydv;
        return monthdaydv;
    case YearMonth:     
        YearMonthDatatypeValidator* yearmonthdv;
        serEng>>yearmonthdv;
        return yearmonthdv;
    case Year:          
        YearDatatypeValidator* yeardv;
        serEng>>yeardv;
        return yeardv;
    case Month:        
        MonthDatatypeValidator* monthdv;
        serEng>>monthdv;
        return monthdv;
    case Day:           
        DayDatatypeValidator* daydv;
        serEng>>daydv;
        return daydv;
    case ID:           
        IDDatatypeValidator* iddv;
        serEng>>iddv;
        return iddv;
    case IDREF:         
        IDREFDatatypeValidator* idrefdv;
        serEng>>idrefdv;
        return idrefdv;
    case ENTITY:       
        ENTITYDatatypeValidator* entitydv;
        serEng>>entitydv;
        return entitydv;
    case NOTATION:     
        NOTATIONDatatypeValidator* notationdv;
        serEng>>notationdv;
        return notationdv;
    case List:          
        ListDatatypeValidator* listdv;
        serEng>>listdv;
        return listdv;
    case Union:         
        UnionDatatypeValidator* uniondv;
        serEng>>uniondv;
        return uniondv;
    case AnySimpleType:  
        AnySimpleTypeDatatypeValidator* anysimpletypedv;
        serEng>>anysimpletypedv;
        return anysimpletypedv;
    case UnKnown:
        return 0;
    default: //we treat this same as UnKnown
        return 0;
    }

}